

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv__backend_timeout(uv_loop_t *loop)

{
  int iVar1;
  uv_loop_t *loop_local;
  
  if (((loop->stop_flag == 0) &&
      (((loop->active_handles != 0 || ((loop->active_reqs).count != 0)) &&
       (iVar1 = uv__queue_empty(&loop->pending_queue), iVar1 != 0)))) &&
     (((iVar1 = uv__queue_empty(&loop->idle_handles), iVar1 != 0 && ((loop->flags & 2) == 0)) &&
      (loop->closing_handles == (uv_handle_t *)0x0)))) {
    iVar1 = uv__next_timeout(loop);
    return iVar1;
  }
  return 0;
}

Assistant:

static int uv__backend_timeout(const uv_loop_t* loop) {
  if (loop->stop_flag == 0 &&
      /* uv__loop_alive(loop) && */
      (uv__has_active_handles(loop) || uv__has_active_reqs(loop)) &&
      uv__queue_empty(&loop->pending_queue) &&
      uv__queue_empty(&loop->idle_handles) &&
      (loop->flags & UV_LOOP_REAP_CHILDREN) == 0 &&
      loop->closing_handles == NULL)
    return uv__next_timeout(loop);
  return 0;
}